

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int al_ustr_find_set(ALLEGRO_USTR *us,int start_pos,ALLEGRO_USTR *accept)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  uint32_t uc;
  bool bVar7;
  int set_pos;
  int local_2c;
  
  if (accept == (ALLEGRO_USTR *)0x0) {
    puVar6 = (uchar *)0x0;
    iVar2 = 0;
  }
  else {
    puVar6 = accept->data;
    iVar2 = 0;
    if (0 < accept->slen) {
      iVar2 = accept->slen;
    }
  }
  bVar7 = iVar2 == 0;
  if (!bVar7) {
    uVar1 = *puVar6;
    while (-1 < (char)uVar1) {
      puVar6 = puVar6 + 1;
      bVar7 = iVar2 < 2;
      if (iVar2 < 2) break;
      iVar2 = iVar2 + -1;
      uVar1 = *puVar6;
    }
  }
  if (bVar7) {
    iVar2 = _al_binchr(us,start_pos,accept);
    return iVar2;
  }
  iVar2 = 0;
  while( true ) {
    while (uVar3 = al_ustr_get(us,iVar2), uVar3 == 0xfffffffe) {
      iVar2 = iVar2 + 1;
    }
    if (uVar3 == 0xffffffff) break;
    local_2c = 0;
    while (uVar4 = al_ustr_get_next(accept,&local_2c), uVar4 != 0xffffffff) {
      if (uVar3 == uVar4) {
        return iVar2;
      }
    }
    iVar5 = 1;
    if (((0x7f < uVar3) && (iVar5 = 2, 0x7ff < uVar3)) && (iVar5 = 3, 0xffff < uVar3)) {
      iVar5 = (uint)(uVar3 < 0x110000) << 2;
    }
    iVar2 = iVar2 + iVar5;
  }
  return -1;
}

Assistant:

int al_ustr_find_set(const ALLEGRO_USTR *us, int start_pos,
   const ALLEGRO_USTR *accept)
{
   int rc;
   int32_t c, d;
   int pos;
   int set_pos;

   /* Fast path for ASCII characters. */
   if (all_ascii(accept)) {
      rc = _al_binchr(us, start_pos, accept);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII. */
   pos = 0;
   while ((c = al_ustr_get(us, pos)) != -1) {
      if (c == -2) {
         /* Invalid byte sequence. */
         pos++;
         continue;
      }

      set_pos = 0;
      while ((d = al_ustr_get_next(accept, &set_pos)) != -1) {
         if (c == d)
            return pos;
      }

      pos += al_utf8_width(c);
   }

   return -1;
}